

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

parser_error parse_room_flags(parser *p)

{
  errr eVar1;
  void *pvVar2;
  char *pcVar3;
  char *flag_name;
  parser_error pVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getstr(p,"flags");
    pcVar3 = string_make(pcVar3);
    flag_name = strtok(pcVar3," |");
    pVar4 = PARSE_ERROR_NONE;
    while (flag_name != (char *)0x0) {
      eVar1 = grab_flag((bitflag *)((long)pvVar2 + 0x18),1,room_flags,flag_name);
      if (eVar1 != 0) {
        pVar4 = PARSE_ERROR_INVALID_FLAG;
        break;
      }
      flag_name = strtok((char *)0x0," |");
    }
    mem_free(pcVar3);
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_room_flags(struct parser *p) {
	struct room_template *t = parser_priv(p);
	char *s, *st;

	if (!t)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	s = string_make(parser_getstr(p, "flags"));
	st = strtok(s, " |");
	while (st && !grab_flag(t->flags, ROOMF_SIZE, room_flags, st)) {
		st = strtok(NULL, " |");
	}
	mem_free(s);

	return st ? PARSE_ERROR_INVALID_FLAG : PARSE_ERROR_NONE;
}